

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O1

void gf256_mul_mem(void *vz,void *vx,uint8_t y,int bytes)

{
  long lVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  undefined7 in_register_00000011;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  
  if (y < 2) {
    if (y == '\0') {
      memset(vz,0,(long)bytes);
      return;
    }
    if (vz != vx) {
      memcpy(vz,vx,(long)bytes);
      return;
    }
  }
  else {
    if ((0x1f < bytes) && (CpuHasAVX2)) {
      alVar4 = GF256Ctx.MM256.TABLE_LO_Y[y];
      alVar5 = GF256Ctx.MM256.TABLE_HI_Y[y];
      auVar13[8] = 0xf;
      auVar13._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar13[9] = 0xf;
      auVar13[10] = 0xf;
      auVar13[0xb] = 0xf;
      auVar13[0xc] = 0xf;
      auVar13[0xd] = 0xf;
      auVar13[0xe] = 0xf;
      auVar13[0xf] = 0xf;
      auVar13[0x10] = 0xf;
      auVar13[0x11] = 0xf;
      auVar13[0x12] = 0xf;
      auVar13[0x13] = 0xf;
      auVar13[0x14] = 0xf;
      auVar13[0x15] = 0xf;
      auVar13[0x16] = 0xf;
      auVar13[0x17] = 0xf;
      auVar13[0x18] = 0xf;
      auVar13[0x19] = 0xf;
      auVar13[0x1a] = 0xf;
      auVar13[0x1b] = 0xf;
      auVar13[0x1c] = 0xf;
      auVar13[0x1d] = 0xf;
      auVar13[0x1e] = 0xf;
      auVar13[0x1f] = 0xf;
      uVar11 = bytes;
      do {
        auVar15 = vpsrlq_avx2(*vx,4);
        auVar9 = vpand_avx2(*vx,auVar13);
        auVar10 = vpshufb_avx2((undefined1  [32])alVar4,auVar9);
        auVar9 = vpand_avx2(auVar15,auVar13);
        auVar9 = vpshufb_avx2((undefined1  [32])alVar5,auVar9);
        *(undefined1 (*) [32])vz = auVar9 ^ auVar10;
        bytes = uVar11 - 0x20;
        vx = (void *)((long)vx + 0x20);
        vz = (void *)((long)vz + 0x20);
        bVar6 = 0x3f < (int)uVar11;
        uVar11 = bytes;
      } while (bVar6);
    }
    if ((0xf < bytes) && (CpuHasSSSE3 == true)) {
      alVar2 = GF256Ctx.MM128.TABLE_LO_Y[y];
      alVar3 = GF256Ctx.MM128.TABLE_HI_Y[y];
      auVar12[8] = 0xf;
      auVar12._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar12[9] = 0xf;
      auVar12[10] = 0xf;
      auVar12[0xb] = 0xf;
      auVar12[0xc] = 0xf;
      auVar12[0xd] = 0xf;
      auVar12[0xe] = 0xf;
      auVar12[0xf] = 0xf;
      uVar11 = bytes;
      do {
        auVar14 = vpsrlq_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])vx,4);
        auVar7 = vpand_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])vx,auVar12);
        auVar8 = vpshufb_avx((undefined1  [16])alVar2,auVar7);
        auVar7 = vpand_avx(auVar14,auVar12);
        auVar7 = vpshufb_avx((undefined1  [16])alVar3,auVar7);
        *(undefined1 (*) [16])*(undefined1 (*) [32])vz = auVar7 ^ auVar8;
        bytes = uVar11 - 0x10;
        vx = *(undefined1 (*) [32])vx + 0x10;
        vz = *(undefined1 (*) [32])vz + 0x10;
        bVar6 = 0x1f < (int)uVar11;
        uVar11 = bytes;
      } while (bVar6);
    }
    lVar1 = (ulong)(uint)((int)CONCAT71(in_register_00000011,y) << 8) + 0x1ece80;
    uVar11 = bytes;
    if (7 < bytes) {
      do {
        *(ulong *)*(undefined1 (*) [32])vz =
             CONCAT17(*(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[7]),
                      CONCAT16(*(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[6]),
                               CONCAT15(*(undefined1 *)
                                         (lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[5]),
                                        CONCAT14(*(undefined1 *)
                                                  (lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)
                                                                        [4]),
                                                 CONCAT13(*(undefined1 *)
                                                           (lVar1 + (ulong)(byte)(*(undefined1
                                                                                    (*) [32])vx)[3])
                                                          ,CONCAT12(*(undefined1 *)
                                                                     (lVar1 + (ulong)(byte)(*(
                                                  undefined1 (*) [32])vx)[2]),
                                                  CONCAT11(*(undefined1 *)
                                                            (lVar1 + (ulong)(byte)(*(undefined1
                                                                                     (*) [32])vx)[1]
                                                            ),*(undefined1 *)
                                                               (lVar1 + (ulong)(byte)(*(undefined1
                                                                                        (*) [32])vx)
                                                                                     [0]))))))));
        bytes = uVar11 - 8;
        vx = *(undefined1 (*) [32])vx + 8;
        vz = *(undefined1 (*) [32])vz + 8;
        bVar6 = 0xf < (int)uVar11;
        uVar11 = bytes;
      } while (bVar6);
    }
    uVar11 = bytes & 4;
    if (uVar11 != 0) {
      *(uint *)*(undefined1 (*) [32])vz =
           CONCAT13(*(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[3]),
                    CONCAT12(*(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[2]),
                             CONCAT11(*(undefined1 *)
                                       (lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[1]),
                                      *(undefined1 *)
                                       (lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[0]))));
    }
    switch(bytes & 3) {
    case 3:
      (*(undefined1 (*) [32])vz)[(ulong)uVar11 + 2] =
           *(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[(ulong)uVar11 + 2]);
    case 2:
      (*(undefined1 (*) [32])vz)[(ulong)uVar11 + 1] =
           *(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[(ulong)uVar11 + 1]);
    case 1:
      (*(undefined1 (*) [32])vz)[uVar11] =
           *(undefined1 *)(lVar1 + (ulong)(byte)(*(undefined1 (*) [32])vx)[uVar11]);
    }
  }
  return;
}

Assistant:

void gf256_mul_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx, uint8_t y, int bytes)
{
    // Use a single if-statement to handle special cases
    if (y <= 1)
    {
        if (y == 0)
            memset(vz, 0, bytes);
        else if (vz != vx)
            memcpy(vz, vx, bytes);
        return;
    }

    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128 *>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128 *>(vx);

#if defined(GF256_TARGET_MOBILE)
#if defined(GF256_TRY_NEON)
    if (bytes >= 16 && CpuHasNeon)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_LO_Y + y));
        const GF256_M128 table_hi_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_HI_Y + y));

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = vdupq_n_u8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 l0 = vandq_u8(x0, clr_mask);
            x0 = vshrq_n_u8(x0, 4);
            GF256_M128 h0 = vandq_u8(x0, clr_mask);
            l0 = vqtbl1q_u8(table_lo_y, l0);
            h0 = vqtbl1q_u8(table_hi_y, h0);
            vst1q_u8((uint8_t*)z16, veorq_u8(l0, h0));

            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif
#else
# if defined(GF256_TRY_AVX2)
    if (bytes >= 32 && CpuHasAVX2)
    {
        // Partial product tables; see above
        const GF256_M256 table_lo_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_LO_Y + y);
        const GF256_M256 table_hi_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M256 clr_mask = _mm256_set1_epi8(0x0f);

        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(vz);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(vx);

        // Handle multiples of 32 bytes
        do
        {
            // See above comments for details
            GF256_M256 x0 = _mm256_loadu_si256(x32);
            GF256_M256 l0 = _mm256_and_si256(x0, clr_mask);
            x0 = _mm256_srli_epi64(x0, 4);
            GF256_M256 h0 = _mm256_and_si256(x0, clr_mask);
            l0 = _mm256_shuffle_epi8(table_lo_y, l0);
            h0 = _mm256_shuffle_epi8(table_hi_y, h0);
            _mm256_storeu_si256(z32, _mm256_xor_si256(l0, h0));

            bytes -= 32, ++x32, ++z32;
        } while (bytes >= 32);

        z16 = reinterpret_cast<GF256_M128 *>(z32);
        x16 = reinterpret_cast<const GF256_M128 *>(x32);
    }
# endif // GF256_TRY_AVX2
    if (bytes >= 16 && CpuHasSSSE3)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_LO_Y + y);
        const GF256_M128 table_hi_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = _mm_set1_epi8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 l0 = _mm_and_si128(x0, clr_mask);
            x0 = _mm_srli_epi64(x0, 4);
            GF256_M128 h0 = _mm_and_si128(x0, clr_mask);
            l0 = _mm_shuffle_epi8(table_lo_y, l0);
            h0 = _mm_shuffle_epi8(table_hi_y, h0);
            _mm_storeu_si128(z16, _mm_xor_si128(l0, h0));

            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t*>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t*>(x16);
    const uint8_t * GF256_RESTRICT table = GF256Ctx.GF256_MUL_TABLE + ((unsigned)y << 8);

    // Handle blocks of 8 bytes
    while (bytes >= 8)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint64_t word = (uint64_t)table[x1[0]] << 56;
        word |= (uint64_t)table[x1[1]] << 48;
        word |= (uint64_t)table[x1[2]] << 40;
        word |= (uint64_t)table[x1[3]] << 32;
        word |= (uint64_t)table[x1[4]] << 24;
        word |= (uint64_t)table[x1[5]] << 16;
        word |= (uint64_t)table[x1[6]] << 8;
        word |= (uint64_t)table[x1[7]];
#else
        uint64_t word = table[x1[0]];
        word |= (uint64_t)table[x1[1]] << 8;
        word |= (uint64_t)table[x1[2]] << 16;
        word |= (uint64_t)table[x1[3]] << 24;
        word |= (uint64_t)table[x1[4]] << 32;
        word |= (uint64_t)table[x1[5]] << 40;
        word |= (uint64_t)table[x1[6]] << 48;
        word |= (uint64_t)table[x1[7]] << 56;
#endif
        *z8 = word;

        bytes -= 8, x1 += 8, z1 += 8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint32_t word = (uint32_t)table[x1[0]] << 24;
        word |= (uint32_t)table[x1[1]] << 16;
        word |= (uint32_t)table[x1[2]] << 8;
        word |= (uint32_t)table[x1[3]];
#else
        uint32_t word = table[x1[0]];
        word |= (uint32_t)table[x1[1]] << 8;
        word |= (uint32_t)table[x1[2]] << 16;
        word |= (uint32_t)table[x1[3]] << 24;
#endif
        *z4 = word;
    }

    // Handle single bytes
    const int offset = four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] = table[x1[offset + 2]];
    case 2: z1[offset + 1] = table[x1[offset + 1]];
    case 1: z1[offset] = table[x1[offset]];
    default:
        break;
    }
}